

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnCallIndirect
          (SharedValidator *this,Location *loc,Var *sig_var,Var *table_var)

{
  Result rhs;
  Var local_100;
  Enum local_b4;
  Var local_b0;
  Enum local_64;
  undefined1 local_60 [8];
  FuncType func_type;
  Var *table_var_local;
  Var *sig_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  func_type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)table_var;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  this->expr_loc_ = loc;
  FuncType::FuncType((FuncType *)local_60);
  Var::Var(&local_b0,sig_var);
  local_64 = (Enum)CheckFuncTypeIndex(this,&local_b0,(FuncType *)local_60);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_64);
  Var::~Var(&local_b0);
  Var::Var(&local_100,table_var);
  local_b4 = (Enum)CheckTableIndex(this,&local_100,(TableType *)0x0);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_b4);
  Var::~Var(&local_100);
  rhs = TypeChecker::OnCallIndirect
                  (&this->typechecker_,(TypeVector *)local_60,
                   (TypeVector *)
                   &func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  FuncType::~FuncType((FuncType *)local_60);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnCallIndirect(const Location& loc,
                                       Var sig_var,
                                       Var table_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  FuncType func_type;
  result |= CheckFuncTypeIndex(sig_var, &func_type);
  result |= CheckTableIndex(table_var);
  result |= typechecker_.OnCallIndirect(func_type.params, func_type.results);
  return result;
}